

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_rawDataResize(Context *context,IntrinsicResult partialResult)

{
  ValueType VVar1;
  anon_union_8_3_2f476f46_for_data aVar2;
  ListStorage<MiniScript::TACLine> *pLVar3;
  int32_t iVar4;
  long *plVar5;
  undefined4 *puVar6;
  StringStorage *pSVar7;
  char *pcVar8;
  String *msg;
  Value dataWrapper;
  Value self;
  Value v;
  Value local_b8;
  Value local_a8;
  IndexException local_98;
  String local_68;
  long *local_58;
  char local_50;
  long *local_48;
  anon_union_8_3_2f476f46_for_data local_40;
  Value local_38;
  
  local_40.tempNum._0_1_ = '\0';
  plVar5 = (long *)operator_new(0x30);
  plVar5[1] = 1;
  *plVar5 = (long)&PTR__StringStorage_001d10b0;
  plVar5[3] = 5;
  plVar5[4] = -1;
  puVar6 = (undefined4 *)operator_new__(5);
  plVar5[2] = (long)puVar6;
  *(undefined1 *)(puVar6 + 1) = 0;
  *puVar6 = 0x666c6573;
  local_48 = plVar5;
  MiniScript::Context::GetVar
            ((Context *)&local_a8,(String *)partialResult.rs,(LocalOnlyMode)&local_48);
  if ((local_48 != (long *)0x0) && (local_40.tempNum._0_1_ == '\0')) {
    plVar5 = local_48 + 1;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (**(code **)(*local_48 + 8))();
    }
    local_48 = (long *)0x0;
  }
  local_50 = '\0';
  plVar5 = (long *)operator_new(0x30);
  plVar5[1] = 1;
  *plVar5 = (long)&PTR__StringStorage_001d10b0;
  plVar5[3] = 6;
  plVar5[4] = -1;
  puVar6 = (undefined4 *)operator_new__(6);
  plVar5[2] = (long)puVar6;
  *(undefined2 *)(puVar6 + 1) = 0x73;
  *puVar6 = 0x65747962;
  local_58 = plVar5;
  MiniScript::Context::GetVar
            ((Context *)&local_98,(String *)partialResult.rs,(LocalOnlyMode)&local_58);
  iVar4 = MiniScript::Value::IntValue((Value *)&local_98);
  if ((2 < (byte)local_98.super_RuntimeException.super_MiniscriptException.super_exception) &&
     (local_98.super_RuntimeException.super_MiniscriptException.location.context.ss !=
      (StringStorage *)0x0)) {
    plVar5 = (long *)((long)local_98.super_RuntimeException.super_MiniscriptException.location.
                            context.ss + 8);
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*((local_98.super_RuntimeException.super_MiniscriptException.location.context.ss)->
        super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_98.super_RuntimeException.super_MiniscriptException.location.context.ss =
         (StringStorage *)0x0;
  }
  if ((local_58 != (long *)0x0) && (local_50 == '\0')) {
    plVar5 = local_58 + 1;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (**(code **)(*local_58 + 8))();
    }
    local_58 = (long *)0x0;
  }
  if (iVar4 < 0) {
    local_68.isTemp = false;
    pSVar7 = (StringStorage *)operator_new(0x30);
    (pSVar7->super_RefCountedStorage).refCount = 1;
    (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar7->dataSize = 0x1d;
    pSVar7->charCount = -1;
    pcVar8 = (char *)operator_new__(0x1d);
    pSVar7->data = pcVar8;
    msg = &local_68;
    builtin_strncpy(pcVar8,"bytes parameter must be >= 0",0x1d);
    local_68.ss = pSVar7;
    MiniScript::IndexException::IndexException(&local_98,msg);
    MiniScript::IndexException::raise(&local_98,(int)msg);
    local_98.super_RuntimeException.super_MiniscriptException._0_8_ =
         &PTR__MiniscriptException_001d1358;
    if (((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)
         local_98.super_RuntimeException.super_MiniscriptException.message.ss !=
         (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
       (local_98.super_RuntimeException.super_MiniscriptException.message.isTemp == false)) {
      plVar5 = &((local_98.super_RuntimeException.super_MiniscriptException.message.ss)->
                super_RefCountedStorage).refCount;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((local_98.super_RuntimeException.super_MiniscriptException.message.ss)->
          super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_98.super_RuntimeException.super_MiniscriptException.message.ss = (StringStorage *)0x0;
    }
    if ((local_98.super_RuntimeException.super_MiniscriptException.location.context.ss !=
         (StringStorage *)0x0) &&
       (local_98.super_RuntimeException.super_MiniscriptException.location.context.isTemp == false))
    {
      plVar5 = (long *)((long)local_98.super_RuntimeException.super_MiniscriptException.location.
                              context.ss + 8);
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((local_98.super_RuntimeException.super_MiniscriptException.location.context.ss)->
          super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_98.super_RuntimeException.super_MiniscriptException.location.context.ss =
           (StringStorage *)0x0;
    }
    std::exception::~exception((exception *)&local_98);
    if ((local_68.ss != (StringStorage *)0x0) && (local_68.isTemp == false)) {
      plVar5 = &((local_68.ss)->super_RefCountedStorage).refCount;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((local_68.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_68.ss = (StringStorage *)0x0;
    }
  }
  aVar2 = _handle.data;
  VVar1 = _handle.type;
  if ((Temp < _handle.type) && (_handle.data.ref != (RefCountedStorage *)0x0)) {
    (_handle.data.ref)->refCount = (_handle.data.ref)->refCount + 1;
  }
  MiniScript::Value::Lookup(&local_b8,&local_a8);
  if ((Temp < VVar1) && (aVar2.ref != (RefCountedStorage *)0x0)) {
    plVar5 = &(aVar2.ref)->refCount;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*(aVar2.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  if (local_b8.type != Handle) {
    local_38.data.ref = (RefCountedStorage *)operator_new(0x20);
    (local_38.data.ref)->refCount = 1;
    ((RefCountedStorage *)&(local_38.data.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage =
         (_func_int **)&PTR__RawDataHandleStorage_001d1568;
    local_38.data.ref[1]._vptr_RefCountedStorage = (_func_int **)0x0;
    *(ValueType *)&((RefCountedStorage *)((long)local_38.data + 0x10))->refCount = Null;
    *(bool *)((long)&((RefCountedStorage *)((long)local_38.data + 0x10))->refCount + 1) = false;
    *(LocalOnlyMode *)((long)&((RefCountedStorage *)((long)local_38.data + 0x10))->refCount + 2) =
         Off;
    *(undefined5 *)((long)&((RefCountedStorage *)((long)local_38.data + 0x10))->refCount + 3) = 0;
    local_38.localOnly = Off;
    local_38.type = Handle;
    local_38.noInvoke = false;
    MiniScript::Value::operator=(&local_b8,&local_38);
    if ((Temp < local_38.type) &&
       ((IntrinsicResultStorage *)local_38.data.ref != (IntrinsicResultStorage *)0x0)) {
      plVar5 = &(local_38.data.ref)->refCount;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((RefCountedStorage *)&(local_38.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_38.data.number = 0.0;
    }
    MiniScript::Value::GetDict((ValueDict *)&local_98,&local_a8);
    MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&local_98
               ,&_handle,&local_b8);
    local_98.super_RuntimeException.super_MiniscriptException._0_8_ = &PTR__Dictionary_001d1238;
    if ((local_98.super_RuntimeException.super_MiniscriptException.location.context.ss !=
         (StringStorage *)0x0) &&
       (local_98.super_RuntimeException.super_MiniscriptException.location.context.isTemp == false))
    {
      plVar5 = (long *)((long)local_98.super_RuntimeException.super_MiniscriptException.location.
                              context.ss + 8);
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((local_98.super_RuntimeException.super_MiniscriptException.location.context.ss)->
          super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_98.super_RuntimeException.super_MiniscriptException.location.context.ss =
           (StringStorage *)0x0;
    }
  }
  RawDataHandleStorage::resize((RawDataHandleStorage *)local_b8.data.ref,(long)iVar4);
  MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  pLVar3 = MiniScript::IntrinsicResult::Null;
  (context->code).ls = MiniScript::IntrinsicResult::Null;
  if (pLVar3 != (ListStorage<MiniScript::TACLine> *)0x0) {
    plVar5 = &(pLVar3->super_RefCountedStorage).refCount;
    *plVar5 = *plVar5 + 1;
  }
  if ((Temp < local_b8.type) &&
     ((RawDataHandleStorage *)local_b8.data.ref != (RawDataHandleStorage *)0x0)) {
    plVar5 = &(local_b8.data.ref)->refCount;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*((RefCountedStorage *)&(local_b8.data.ref)->_vptr_RefCountedStorage)->
        _vptr_RefCountedStorage[1])();
    }
    local_b8.data.number = 0.0;
  }
  if ((Temp < local_a8.type) && (local_a8.data.ref != (RefCountedStorage *)0x0)) {
    plVar5 = &(local_a8.data.ref)->refCount;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*(local_a8.data.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_rawDataResize(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	long nBytes = context->GetVar("bytes").IntValue();
	if (nBytes < 0) {
		IndexException(String("bytes parameter must be >= 0")).raise();
	}
	Value dataWrapper = self.Lookup(_handle);
	if (dataWrapper.IsNull() or dataWrapper.type != ValueType::Handle) {
		dataWrapper = Value::NewHandle(new RawDataHandleStorage());
		self.GetDict().SetValue(_handle, dataWrapper);
	}
	RawDataHandleStorage *storage = (RawDataHandleStorage*)dataWrapper.data.ref;
	storage->resize(nBytes);
	return IntrinsicResult::Null;
}